

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

void __thiscall cmComputeLinkDepends::AddDirectLinkEntries(cmComputeLinkDepends *this)

{
  cmLinkImplementation *libs;
  pointer item;
  
  libs = cmGeneratorTarget::GetLinkImplementation(this->Target,&this->Config);
  AddLinkEntries<cmLinkImplItem>
            (this,-1,(vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)libs);
  for (item = (libs->super_cmLinkImplementationLibraries).WrongConfigLibraries.
              super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
              super__Vector_impl_data._M_start;
      item != (libs->super_cmLinkImplementationLibraries).WrongConfigLibraries.
              super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
              super__Vector_impl_data._M_finish; item = item + 1) {
    CheckWrongConfigItem(this,item);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::AddDirectLinkEntries()
{
  // Add direct link dependencies in this configuration.
  cmLinkImplementation const* impl =
    this->Target->GetLinkImplementation(this->Config);
  this->AddLinkEntries(-1, impl->Libraries);
  for(std::vector<cmLinkItem>::const_iterator
        wi = impl->WrongConfigLibraries.begin();
      wi != impl->WrongConfigLibraries.end(); ++wi)
    {
    this->CheckWrongConfigItem(*wi);
    }
}